

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generics.c++
# Opt level: O3

Maybe<capnp::compiler::BrandedDecl> * __thiscall
capnp::compiler::BrandScope::lookupParameter
          (Maybe<capnp::compiler::BrandedDecl> *__return_storage_ptr__,BrandScope *this,
          Resolver *resolver,uint64_t scopeId,uint index)

{
  uint64_t uVar1;
  BrandedDecl *pBVar2;
  Reader brand;
  undefined1 auVar3 [32];
  NullableValue<capnp::compiler::BrandedDecl> *pNVar4;
  Fault f;
  undefined1 uStack_161;
  undefined4 uStack_15c;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  Fault local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  char local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined1 local_98 [40];
  char local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined1 local_38 [16];
  
  uVar1 = this->leafId;
  while( true ) {
    if (uVar1 == scopeId) {
      if ((ulong)index < (this->params).size_) {
        pBVar2 = (this->params).ptr;
        (__return_storage_ptr__->ptr).isSet = true;
        BrandedDecl::BrandedDecl(&(__return_storage_ptr__->ptr).field_1.value,pBVar2 + index);
      }
      else if (this->inherited == true) {
        (__return_storage_ptr__->ptr).isSet = false;
      }
      else {
        (*resolver->_vptr_Resolver[2])(&local_f8,resolver,0x1e);
        if (local_d0 != '\0') {
          local_108 = local_a8;
          uStack_100 = uStack_a0;
          local_118 = local_b8;
          uStack_110 = uStack_b0;
          local_128 = local_c8;
          uStack_120 = uStack_c0;
          local_68 = local_c8;
          uStack_60 = uStack_c0;
          local_58 = local_b8;
          uStack_50 = uStack_b0;
          local_48 = local_a8;
          uStack_40 = uStack_a0;
        }
        local_70 = local_d0;
        brand.reader._39_1_ = uStack_161;
        brand.reader.structDataSize = 0;
        brand.reader.structPointerCount = 0;
        brand.reader.elementSize = INLINE_COMPOSITE;
        brand.reader._44_4_ = uStack_15c;
        brand.reader.nestingLimit = 0x7fffffff;
        auVar3 = ZEXT1632(ZEXT816(0));
        brand.reader.segment = (SegmentReader *)auVar3._0_8_;
        brand.reader.capTable = (CapTableReader *)auVar3._8_8_;
        brand.reader.ptr = (byte *)auVar3._16_8_;
        brand.reader.elementCount = auVar3._24_4_;
        brand.reader.step = auVar3._28_4_;
        evaluateBrand((BrandScope *)local_38,(Resolver *)this,(ResolvedDecl *)resolver,brand,
                      (uint)local_98);
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x28) = local_d8;
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x18) = local_e8;
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x20) = uStack_e0;
        *(Exception **)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = local_f8.exception;
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) = uStack_f0;
        if (local_d0 != '\0') {
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x58) = local_108;
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x60) = uStack_100;
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x48) = local_118;
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x50) = uStack_110;
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x38) = local_128;
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x40) = uStack_120;
        }
        (__return_storage_ptr__->ptr).isSet = true;
        (__return_storage_ptr__->ptr).field_1.value.body.tag = 1;
        *(char *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x30) = local_d0;
        (__return_storage_ptr__->ptr).field_1.value.brand.disposer = (Disposer *)local_38._0_8_;
        (__return_storage_ptr__->ptr).field_1.value.brand.ptr = (BrandScope *)local_38._8_8_;
        (__return_storage_ptr__->ptr).field_1.value.source._reader.segment = (SegmentReader *)0x0;
        (__return_storage_ptr__->ptr).field_1.value.source._reader.capTable = (CapTableReader *)0x0;
        (__return_storage_ptr__->ptr).field_1.value.source._reader.data = (void *)0x0;
        (__return_storage_ptr__->ptr).field_1.value.source._reader.pointers = (WirePointer *)0x0;
        pNVar4 = &__return_storage_ptr__->ptr;
        *(StructDataBitCount *)((long)&pNVar4->field_1 + 0x98) = 0;
        *(StructPointerCount *)((long)&pNVar4->field_1 + 0x9c) = 0;
        *(undefined2 *)((long)&pNVar4->field_1 + 0x9e) = 0;
        *(undefined8 *)&(__return_storage_ptr__->ptr).field_1.value.source._reader.nestingLimit =
             0x7fffffff;
      }
      return __return_storage_ptr__;
    }
    this = (this->parent).ptr.ptr;
    if (this == (BrandScope *)0x0) break;
    uVar1 = this->leafId;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[22]>
            (&local_f8,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/generics.c++"
             ,0x159,FAILED,(char *)0x0,"\"scope is not a parent\"",
             (char (*) [22])"scope is not a parent");
  kj::_::Debug::Fault::fatal(&local_f8);
}

Assistant:

kj::Maybe<BrandedDecl> BrandScope::lookupParameter(
    Resolver& resolver, uint64_t scopeId, uint index) {
  // Returns null if the param should be inherited from the client scope.

  if (scopeId == leafId) {
    if (index < params.size()) {
      return params[index];
    } else if (inherited) {
      return kj::none;
    } else {
      // Unbound and not inherited, so return AnyPointer.
      auto decl = resolver.resolveBuiltin(Declaration::BUILTIN_ANY_POINTER);
      return BrandedDecl(decl,
          evaluateBrand(resolver, decl, List<schema::Brand::Scope>::Reader()),
          Expression::Reader());
    }
  } else KJ_IF_SOME(p, parent) {
    return p.get()->lookupParameter(resolver, scopeId, index);
  } else {
    KJ_FAIL_REQUIRE("scope is not a parent");
  }
}